

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.h
# Opt level: O3

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>::AddElement
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle> *this,TPZCompEl *cel,int64_t meshindex)

{
  TPZCompElSide *pTVar1;
  int iVar2;
  undefined8 in_RAX;
  TPZGeoEl *pTVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if ((this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements <= meshindex) {
    (*(this->fElementVec).super_TPZVec<TPZCompElSide>._vptr_TPZVec[3])
              (&this->fElementVec,meshindex + 1);
    uStack_28 = CONCAT44(1,(undefined4)uStack_28);
    TPZManVector<int,_5>::Resize
              (&(this->super_TPZMultiphysicsElement).fActiveApproxSpace,meshindex + 1,
               (int *)((long)&uStack_28 + 4));
  }
  if (cel == (TPZCompEl *)0x0) {
    iVar2 = -1;
    cel = (TPZCompEl *)0x0;
  }
  else {
    pTVar3 = TPZCompEl::Reference(cel);
    iVar2 = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3);
    iVar2 = iVar2 + -1;
  }
  pTVar1 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore;
  pTVar1[meshindex].fEl = cel;
  pTVar1[meshindex].fSide = iVar2;
  return;
}

Assistant:

virtual void AddElement(TPZCompEl *cel, int64_t meshindex) override
    {
		if (fElementVec.size() <= meshindex) 
		{
			fElementVec.resize(meshindex+1);
            fActiveApproxSpace.Resize(meshindex+1, 1);
		}
        if (cel)
        {
            TPZGeoEl *gel = cel->Reference();
            TPZCompElSide celside(cel,gel->NSides()-1);
            fElementVec[meshindex] = celside;
        }
        else
        {
            fElementVec[meshindex] = TPZCompElSide();
        }
    }